

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O3

bool Assimp::Ogre::OgreXmlSerializer::ImportSkeleton(IOSystem *pIOHandler,Mesh *mesh)

{
  Skeleton *this;
  bool bVar1;
  XmlReaderPtr reader;
  OgreXmlSerializer serializer;
  undefined1 local_58 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  if ((mesh == (Mesh *)0x0) || ((mesh->skeletonRef)._M_string_length == 0)) {
    bVar1 = false;
  }
  else {
    OpenReader((OgreXmlSerializer *)local_58,pIOHandler,&mesh->skeletonRef);
    bVar1 = (XmlReader *)local_58._0_8_ != (XmlReader *)0x0;
    if (bVar1) {
      this = (Skeleton *)operator_new(0x38);
      Skeleton::Skeleton(this);
      local_58._16_8_ = local_58._0_8_;
      local_40._8_8_ = 0;
      local_30._M_local_buf[0] = '\0';
      local_40._M_allocated_capacity = (size_type)&local_30;
      ReadSkeleton((OgreXmlSerializer *)(local_58 + 0x10),this);
      mesh->skeleton = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_allocated_capacity != &local_30) {
        operator_delete((void *)local_40._M_allocated_capacity);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
  }
  return bVar1;
}

Assistant:

bool OgreXmlSerializer::ImportSkeleton(Assimp::IOSystem *pIOHandler, Mesh *mesh)
{
    if (!mesh || mesh->skeletonRef.empty())
        return false;

    XmlReaderPtr reader = OpenReader(pIOHandler, mesh->skeletonRef);
    if (!reader.get())
        return false;

    Skeleton *skeleton = new Skeleton();
    OgreXmlSerializer serializer(reader.get());
    serializer.ReadSkeleton(skeleton);
    mesh->skeleton = skeleton;
    return true;
}